

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateFastIsInSymbolOrStringIndex
          (Lowerer *this,Instr *instrInsert,RegOpnd *indexOpnd,RegOpnd *baseOpnd,Opnd *dest,
          uint32 inlineCacheOffset,uint32 hitRateOffset,LabelInstr *labelHelper,
          LabelInstr *labelDone)

{
  Opnd *src;
  uint32 inlineCacheOffset_local;
  Opnd *dest_local;
  RegOpnd *baseOpnd_local;
  RegOpnd *indexOpnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  
  GenerateLookUpInIndexCache
            (this,instrInsert,indexOpnd,baseOpnd,(RegOpnd *)0x0,(RegOpnd *)0x0,inlineCacheOffset,
             hitRateOffset,labelHelper,FldInfo_NoInfo);
  src = LoadLibraryValueOpnd(this,instrInsert,ValueTrue);
  InsertMove(dest,src,instrInsert,true);
  InsertBranch(Br,labelDone,instrInsert);
  return;
}

Assistant:

void
Lowerer::GenerateFastIsInSymbolOrStringIndex(IR::Instr * instrInsert, IR::RegOpnd *indexOpnd, IR::RegOpnd *baseOpnd, IR::Opnd *dest, uint32 inlineCacheOffset, const uint32 hitRateOffset, IR::LabelInstr * labelHelper, IR::LabelInstr * labelDone)
{
    // Try to look up the property in the cache, or bail to helper
    GenerateLookUpInIndexCache(instrInsert, indexOpnd, baseOpnd, nullptr /*opndSlotArray*/, nullptr /*opndSlotIndex*/, inlineCacheOffset, hitRateOffset, labelHelper);

    // MOV dest, true
    InsertMove(dest, LoadLibraryValueOpnd(instrInsert, LibraryValue::ValueTrue), instrInsert);

    // JMP labelDone
    InsertBranch(Js::OpCode::Br, labelDone, instrInsert);
}